

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_ptime.c
# Opt level: O0

uint fmt_ptime2(char *s,taia *ta,char sep)

{
  long local_38;
  time_t u;
  tm *t;
  taia *ptStack_20;
  char sep_local;
  taia *ta_local;
  char *s_local;
  
  if ((ta->sec).x < 0x400000000000000a) {
    s_local._4_4_ = 0;
  }
  else {
    local_38 = (ta->sec).x + 0xbffffffffffffff6;
    t._7_1_ = sep;
    ptStack_20 = ta;
    ta_local = (taia *)s;
    u = (time_t)gmtime(&local_38);
    if ((tm *)u == (tm *)0x0) {
      s_local._4_4_ = 0;
    }
    else {
      fmt_ulong((char *)ta_local,(long)(((tm *)u)->tm_year + 0x76c));
      *(undefined1 *)((long)&(ta_local->sec).x + 4) = 0x2d;
      fmt_uint0((char *)((long)&(ta_local->sec).x + 5),*(int *)(u + 0x10) + 1,2);
      *(undefined1 *)((long)&(ta_local->sec).x + 7) = 0x2d;
      fmt_uint0((char *)&ta_local->nano,*(uint *)(u + 0xc),2);
      *(char *)((long)&ta_local->nano + 2) = t._7_1_;
      fmt_uint0((char *)((long)&ta_local->nano + 3),*(uint *)(u + 8),2);
      *(undefined1 *)((long)&ta_local->nano + 5) = 0x3a;
      fmt_uint0((char *)((long)&ta_local->nano + 6),*(uint *)(u + 4),2);
      *(undefined1 *)&ta_local->atto = 0x3a;
      fmt_uint0((char *)((long)&ta_local->atto + 1),*(uint *)u,2);
      *(undefined1 *)((long)&ta_local->atto + 3) = 0x2e;
      fmt_uint0((char *)((long)&ta_local->atto + 4),(uint)ptStack_20->nano,9);
      s_local._4_4_ = 0x19;
    }
  }
  return s_local._4_4_;
}

Assistant:

unsigned int fmt_ptime2(char *s, struct taia *ta, char sep) {
  struct tm *t;
  time_t u;

  if (ta->sec.x < 4611686018427387914ULL) return(0); /* impossible? */
  u =ta->sec.x -4611686018427387914ULL;
  if (! (t =gmtime((time_t*)&u))) return(0);
  fmt_ulong(s, 1900 +t->tm_year);
  s[4] ='-'; fmt_uint0(&s[5], t->tm_mon +1, 2);
  s[7] ='-'; fmt_uint0(&s[8], t->tm_mday, 2);
  s[10] =sep; fmt_uint0(&s[11], t->tm_hour, 2);
  s[13] =':'; fmt_uint0(&s[14], t->tm_min, 2);
  s[16] =':'; fmt_uint0(&s[17], t->tm_sec, 2);
  s[19] ='.'; fmt_uint0(&s[20], ta->nano, 9);
  return(25);
}